

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O2

OperatorPartitionData * __thiscall
duckdb::DuckTableScanState::TableScanGetPartitionData
          (OperatorPartitionData *__return_storage_ptr__,DuckTableScanState *this,
          ClientContext *context,TableFunctionGetPartitionInput *input)

{
  LocalTableFunctionState *pLVar1;
  
  pLVar1 = optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->(&input->local_state);
  if (pLVar1[1]._vptr_LocalTableFunctionState == (_func_int **)0x0) {
    if (pLVar1[0x12]._vptr_LocalTableFunctionState == (_func_int **)0x0) {
      (__return_storage_ptr__->partition_data).
      super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->partition_data).
      super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __return_storage_ptr__->batch_index = 0;
      (__return_storage_ptr__->partition_data).
      super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->batch_index =
         (long)pLVar1[0x18]._vptr_LocalTableFunctionState +
         (long)pLVar1[7]._vptr_LocalTableFunctionState;
  }
  else {
    __return_storage_ptr__->batch_index = (idx_t)pLVar1[7]._vptr_LocalTableFunctionState;
  }
  (__return_storage_ptr__->partition_data).
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->partition_data).
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->partition_data).
  super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

OperatorPartitionData TableScanGetPartitionData(ClientContext &context,
	                                                TableFunctionGetPartitionInput &input) override {
		auto &l_state = input.local_state->Cast<TableScanLocalState>();
		if (l_state.scan_state.table_state.row_group) {
			return OperatorPartitionData(l_state.scan_state.table_state.batch_index);
		}
		if (l_state.scan_state.local_state.row_group) {
			return OperatorPartitionData(l_state.scan_state.table_state.batch_index +
			                             l_state.scan_state.local_state.batch_index);
		}
		return OperatorPartitionData(0);
	}